

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

char * httplib::detail::find_content_type(string *path)

{
  int iVar1;
  char *pcVar2;
  undefined1 local_30 [8];
  string ext;
  
  file_extension((string *)local_30,path);
  iVar1 = std::__cxx11::string::compare((char *)local_30);
  if (iVar1 == 0) {
    pcVar2 = "text/plain";
  }
  else {
    iVar1 = std::__cxx11::string::compare(local_30);
    if (iVar1 == 0) {
      pcVar2 = "text/html";
    }
    else {
      iVar1 = std::__cxx11::string::compare(local_30);
      if (iVar1 == 0) {
        pcVar2 = "text/css";
      }
      else {
        iVar1 = std::__cxx11::string::compare(local_30);
        pcVar2 = "image/jpg";
        if ((iVar1 != 0) && (iVar1 = std::__cxx11::string::compare(local_30), iVar1 != 0)) {
          iVar1 = std::__cxx11::string::compare(local_30);
          if (iVar1 == 0) {
            pcVar2 = "image/png";
          }
          else {
            iVar1 = std::__cxx11::string::compare(local_30);
            if (iVar1 == 0) {
              pcVar2 = "image/gif";
            }
            else {
              iVar1 = std::__cxx11::string::compare(local_30);
              if (iVar1 == 0) {
                pcVar2 = "image/svg+xml";
              }
              else {
                iVar1 = std::__cxx11::string::compare(local_30);
                if (iVar1 == 0) {
                  pcVar2 = "image/x-icon";
                }
                else {
                  iVar1 = std::__cxx11::string::compare(local_30);
                  if (iVar1 == 0) {
                    pcVar2 = "application/json";
                  }
                  else {
                    iVar1 = std::__cxx11::string::compare(local_30);
                    if (iVar1 == 0) {
                      pcVar2 = "application/pdf";
                    }
                    else {
                      iVar1 = std::__cxx11::string::compare(local_30);
                      if (iVar1 == 0) {
                        pcVar2 = "application/javascript";
                      }
                      else {
                        iVar1 = std::__cxx11::string::compare(local_30);
                        if (iVar1 == 0) {
                          pcVar2 = "application/xml";
                        }
                        else {
                          iVar1 = std::__cxx11::string::compare(local_30);
                          pcVar2 = (char *)0x0;
                          if (iVar1 == 0) {
                            pcVar2 = "application/xhtml+xml";
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (local_30 != (undefined1  [8])&ext._M_string_length) {
    operator_delete((void *)local_30);
  }
  return pcVar2;
}

Assistant:

inline const char* find_content_type(const std::string& path)
{
    auto ext = file_extension(path);
    if (ext == "txt") {
        return "text/plain";
    } else if (ext == "html") {
        return "text/html";
    } else if (ext == "css") {
        return "text/css";
    } else if (ext == "jpeg" || ext == "jpg") {
        return "image/jpg";
    } else if (ext == "png") {
        return "image/png";
    } else if (ext == "gif") {
        return "image/gif";
    } else if (ext == "svg") {
        return "image/svg+xml";
    } else if (ext == "ico") {
        return "image/x-icon";
    } else if (ext == "json") {
        return "application/json";
    } else if (ext == "pdf") {
        return "application/pdf";
    } else if (ext == "js") {
        return "application/javascript";
    } else if (ext == "xml") {
        return "application/xml";
    } else if (ext == "xhtml") {
        return "application/xhtml+xml";
    }
    return nullptr;
}